

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O1

bool SignTransaction(CMutableTransaction *mtx,SigningProvider *keystore,
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    *coins,int nHashType,
                    map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                    *input_errors)

{
  _Base_ptr *txout;
  long lVar1;
  uint nIn;
  const_iterator cVar2;
  pointer pCVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  long in_FS_OFFSET;
  bool bVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_bilingual_str>_>,_std::_Rb_tree_iterator<std::pair<const_int,_bilingual_str>_>_>
  pVar12;
  vector<CTxOut,_std::allocator<CTxOut>_> spent_outputs;
  ScriptError serror;
  SignatureData sigdata;
  PrecomputedTransactionData txdata;
  CTransaction txConst;
  uint local_674;
  BaseSignatureChecker local_670;
  CTransaction *local_668;
  undefined4 local_660;
  uint local_65c;
  _Base_ptr local_658;
  PrecomputedTransactionData *local_650;
  vector<CTxOut,_std::allocator<CTxOut>_> local_648;
  char *local_630;
  string local_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_608;
  long local_600;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5e8;
  long local_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  undefined1 local_5c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558 [2];
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_510 [34];
  PrecomputedTransactionData local_1e0;
  CTransaction local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CTransaction::CTransaction(&local_b8,mtx);
  memset(&local_1e0,0,0x102);
  local_1e0.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_1e0.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_1e0.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_1e0._281_8_ = 0;
  local_648.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_648.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_648.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pCVar3 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != pCVar3) {
    uVar6 = 0;
    uVar8 = 1;
    do {
      cVar2 = std::
              _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
              ::find((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                      *)coins,&pCVar3[uVar6].prevout);
      if ((cVar2._M_node == (_Base_ptr)(coins + 8)) ||
         (cVar2._M_node[2]._M_parent == (_Base_ptr)0xffffffffffffffff)) {
        local_578._0_8_ = (pointer)0x0;
        local_578._8_8_ = (pointer)0x0;
        local_568._0_8_ = (pointer)0x0;
        PrecomputedTransactionData::Init<CTransaction>
                  (&local_1e0,&local_b8,(vector<CTxOut,_std::allocator<CTxOut>_> *)local_578,true);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_578);
        break;
      }
      std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long_const&,CScript_const&>
                ((vector<CTxOut,std::allocator<CTxOut>> *)&local_648,
                 (long *)&cVar2._M_node[2]._M_parent,(CScript *)&cVar2._M_node[2]._M_left);
      pCVar3 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = ((long)(mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar3 >> 3) * 0x4ec4ec4ec4ec4ec5;
      bVar11 = uVar8 <= uVar6;
      lVar1 = uVar6 - uVar8;
      uVar6 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar11 && lVar1 != 0);
  }
  if (((long)local_648.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_648.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 +
      ((long)(mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x4ec4ec4ec4ec4ec5 == 0) {
    PrecomputedTransactionData::Init<CTransaction>(&local_1e0,&local_b8,&local_648,true);
  }
  pCVar3 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != pCVar3) {
    uVar6 = 1;
    uVar8 = 0;
    do {
      uVar7 = uVar6;
      pCVar3 = pCVar3 + uVar8;
      cVar2 = std::
              _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
              ::find((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                      *)coins,&pCVar3->prevout);
      nIn = (int)uVar7 - 1;
      if ((cVar2._M_node == (_Base_ptr)(coins + 8)) ||
         (cVar2._M_node[2]._M_parent == (_Base_ptr)0xffffffffffffffff)) {
        local_578._0_8_ = local_568;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_578,"Input not found or already spent","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_558[0]._M_dataplus._M_p = (pointer)&local_558[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_568 + 0x10),"Input not found or already spent","");
        }
        else {
          local_5c8._0_8_ = "Input not found or already spent";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_568 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                     (char **)local_5c8);
        }
        local_5c8._0_4_ = nIn;
        pmVar4 = std::
                 map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                 ::operator[](input_errors,(key_type_conflict *)local_5c8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&pmVar4->original,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&pmVar4->translated,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_568 + 0x10));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558[0]._M_dataplus._M_p != &local_558[0].field_2) {
          operator_delete(local_558[0]._M_dataplus._M_p,
                          local_558[0].field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_578._0_8_ != (pointer)local_568) {
          operator_delete((void *)local_578._0_8_,(ulong)(local_568._0_8_ + 1));
        }
      }
      else {
        txout = &cVar2._M_node[2]._M_parent;
        DataFromTransaction((SignatureData *)local_578,mtx,nIn,(CTxOut *)txout);
        if (((nHashType & 0xffffff7fU) != 3) ||
           (uVar6 = ((long)(mtx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(mtx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
           uVar8 <= uVar6 && uVar6 - uVar8 != 0)) {
          MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
                    ((MutableTransactionSignatureCreator *)local_5c8,mtx,nIn,(CAmount *)txout,
                     &local_1e0,nHashType);
          ProduceSignature(keystore,(BaseSignatureCreator *)local_5c8,
                           (CScript *)&cVar2._M_node[2]._M_left,(SignatureData *)local_578);
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&(pCVar3->scriptSig).super_CScriptBase,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_578 + 8));
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator=(&(pCVar3->scriptWitness).stack,local_510);
        if ((*txout == (_Base_ptr)0x775f05a074000) &&
           ((pCVar3->scriptWitness).stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pCVar3->scriptWitness).stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          local_5c8._0_8_ = local_5c8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"Missing amount","");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_5a8,"Missing amount","");
          }
          else {
            local_630 = "Missing amount";
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_5a8,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_630);
          }
          local_630 = (char *)CONCAT44(local_630._4_4_,nIn);
          pmVar4 = std::
                   map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                   ::operator[](input_errors,(key_type_conflict *)&local_630);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&pmVar4->original,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8)
          ;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&pmVar4->translated,&local_5a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
            operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
          }
          uVar9 = local_5c8._16_8_;
          _Var10._M_p = (pointer)local_5c8._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_5c8 + 0x10)) goto LAB_0019414b;
        }
        else {
          local_630 = (char *)((ulong)local_630 & 0xffffffff00000000);
          if (local_578[0] == (string)0x0) {
            local_670._vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_003dd700;
            local_668 = &local_b8;
            local_660 = 1;
            local_650 = &local_1e0;
            local_65c = nIn;
            local_658 = *txout;
            bVar11 = VerifyScript(&pCVar3->scriptSig,(CScript *)&cVar2._M_node[2]._M_left,
                                  &pCVar3->scriptWitness,0x1fffdf,&local_670,
                                  (ScriptError *)&local_630);
            bVar11 = !bVar11;
          }
          else {
            bVar11 = false;
          }
          if (bVar11) {
            if ((ScriptError)local_630 == SCRIPT_ERR_SIG_NULLFAIL) {
              local_608 = &local_5f8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_608,
                         "CHECK(MULTI)SIG failing with non-zero signature (possibly need more signatures)"
                         ,"");
              local_5c8._0_8_ = local_5c8 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_5c8,local_608,local_600 + (long)local_608);
              local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5a8,local_608,local_600 + (long)local_608);
              local_674 = nIn;
              pmVar4 = std::
                       map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                       ::operator[](input_errors,(key_type_conflict *)&local_674);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&pmVar4->original,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_5c8);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&pmVar4->translated,&local_5a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
                operator_delete(local_5a8._M_dataplus._M_p,
                                local_5a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5c8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_5c8 + 0x10)) {
                operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
              }
              uVar9 = local_5f8._M_allocated_capacity;
              _Var10._M_p = (pointer)local_608;
              if (local_608 != &local_5f8) goto LAB_0019414b;
            }
            else if ((ScriptError)local_630 == SCRIPT_ERR_INVALID_STACK_OPERATION) {
              local_5e8 = &local_5d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_5e8,
                         "Unable to sign input, invalid stack size (possibly missing key)","");
              local_5c8._0_8_ = local_5c8 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_5c8,local_5e8,local_5e0 + (long)local_5e8);
              local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5a8,local_5e8,local_5e0 + (long)local_5e8);
              local_674 = nIn;
              pmVar4 = std::
                       map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                       ::operator[](input_errors,(key_type_conflict *)&local_674);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&pmVar4->original,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_5c8);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&pmVar4->translated,&local_5a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
                operator_delete(local_5a8._M_dataplus._M_p,
                                local_5a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5c8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_5c8 + 0x10)) {
                operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
              }
              uVar9 = local_5d8._M_allocated_capacity;
              _Var10._M_p = (pointer)local_5e8;
              if (local_5e8 != &local_5d8) {
LAB_0019414b:
                operator_delete(_Var10._M_p,uVar9 + 1);
              }
            }
            else {
              ScriptErrorString_abi_cxx11_(&local_628,(ScriptError)local_630);
              local_5c8._0_8_ = local_5c8 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_5c8,local_628._M_dataplus._M_p,
                         local_628._M_dataplus._M_p + local_628._M_string_length);
              local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5a8,local_628._M_dataplus._M_p,
                         local_628._M_dataplus._M_p + local_628._M_string_length);
              local_674 = nIn;
              pmVar4 = std::
                       map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                       ::operator[](input_errors,(key_type_conflict *)&local_674);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&pmVar4->original,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_5c8);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&pmVar4->translated,&local_5a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
                operator_delete(local_5a8._M_dataplus._M_p,
                                local_5a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5c8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_5c8 + 0x10)) {
                operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
              }
              uVar9 = local_628.field_2._M_allocated_capacity;
              _Var10._M_p = local_628._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_628._M_dataplus._M_p != &local_628.field_2) goto LAB_0019414b;
            }
          }
          else {
            local_5c8._0_4_ = nIn;
            pVar12 = std::
                     _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                     ::equal_range((_Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                                    *)input_errors,(key_type_conflict *)local_5c8);
            std::
            _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
            ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                            *)input_errors,(_Base_ptr)pVar12.first._M_node,
                           (_Base_ptr)pVar12.second._M_node);
          }
        }
        SignatureData::~SignatureData((SignatureData *)local_578);
      }
      pCVar3 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar3 >> 3) * 0x4ec4ec4ec4ec4ec5;
      uVar6 = (ulong)((int)uVar7 + 1);
      uVar8 = uVar7;
    } while (uVar7 <= uVar5 && uVar5 - uVar7 != 0);
  }
  lVar1 = *(long *)(input_errors + 0x28);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_648);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_1e0.m_spent_outputs);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_b8.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_b8.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return lVar1 == 0;
}

Assistant:

bool SignTransaction(CMutableTransaction& mtx, const SigningProvider* keystore, const std::map<COutPoint, Coin>& coins, int nHashType, std::map<int, bilingual_str>& input_errors)
{
    bool fHashSingle = ((nHashType & ~SIGHASH_ANYONECANPAY) == SIGHASH_SINGLE);

    // Use CTransaction for the constant parts of the
    // transaction to avoid rehashing.
    const CTransaction txConst(mtx);

    PrecomputedTransactionData txdata;
    std::vector<CTxOut> spent_outputs;
    for (unsigned int i = 0; i < mtx.vin.size(); ++i) {
        CTxIn& txin = mtx.vin[i];
        auto coin = coins.find(txin.prevout);
        if (coin == coins.end() || coin->second.IsSpent()) {
            txdata.Init(txConst, /*spent_outputs=*/{}, /*force=*/true);
            break;
        } else {
            spent_outputs.emplace_back(coin->second.out.nValue, coin->second.out.scriptPubKey);
        }
    }
    if (spent_outputs.size() == mtx.vin.size()) {
        txdata.Init(txConst, std::move(spent_outputs), true);
    }

    // Sign what we can:
    for (unsigned int i = 0; i < mtx.vin.size(); ++i) {
        CTxIn& txin = mtx.vin[i];
        auto coin = coins.find(txin.prevout);
        if (coin == coins.end() || coin->second.IsSpent()) {
            input_errors[i] = _("Input not found or already spent");
            continue;
        }
        const CScript& prevPubKey = coin->second.out.scriptPubKey;
        const CAmount& amount = coin->second.out.nValue;

        SignatureData sigdata = DataFromTransaction(mtx, i, coin->second.out);
        // Only sign SIGHASH_SINGLE if there's a corresponding output:
        if (!fHashSingle || (i < mtx.vout.size())) {
            ProduceSignature(*keystore, MutableTransactionSignatureCreator(mtx, i, amount, &txdata, nHashType), prevPubKey, sigdata);
        }

        UpdateInput(txin, sigdata);

        // amount must be specified for valid segwit signature
        if (amount == MAX_MONEY && !txin.scriptWitness.IsNull()) {
            input_errors[i] = _("Missing amount");
            continue;
        }

        ScriptError serror = SCRIPT_ERR_OK;
        if (!sigdata.complete && !VerifyScript(txin.scriptSig, prevPubKey, &txin.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, TransactionSignatureChecker(&txConst, i, amount, txdata, MissingDataBehavior::FAIL), &serror)) {
            if (serror == SCRIPT_ERR_INVALID_STACK_OPERATION) {
                // Unable to sign input and verification failed (possible attempt to partially sign).
                input_errors[i] = Untranslated("Unable to sign input, invalid stack size (possibly missing key)");
            } else if (serror == SCRIPT_ERR_SIG_NULLFAIL) {
                // Verification failed (possibly due to insufficient signatures).
                input_errors[i] = Untranslated("CHECK(MULTI)SIG failing with non-zero signature (possibly need more signatures)");
            } else {
                input_errors[i] = Untranslated(ScriptErrorString(serror));
            }
        } else {
            // If this input succeeds, make sure there is no error set for it
            input_errors.erase(i);
        }
    }
    return input_errors.empty();
}